

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test6.cpp
# Opt level: O1

int main(void)

{
  __pid_t msg;
  Writer *pWVar1;
  EventLoop *this;
  long in_FS_OFFSET;
  EventLoopThread loopThread;
  undefined1 local_1d8 [24];
  code *pcStack_1c0;
  LineNumber local_1b8;
  char *local_1b0;
  VerboseLevel local_1a8;
  Logger *local_1a0;
  bool local_198;
  Logger *local_190;
  char *local_188;
  DispatchAction local_180;
  pointer local_178;
  pointer pbStack_170;
  pointer local_168;
  undefined1 local_160 [16];
  Level local_150;
  char *local_148;
  LineNumber local_140;
  char *local_138;
  undefined2 local_130;
  Logger *local_128;
  bool local_120;
  _Alloc_hider local_118;
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  pthread_mutex_t apStack_f8 [5];
  
  local_160._0_8_ = &PTR__Writer_0012cd30;
  local_160._8_8_ = (LogMessage *)0x0;
  local_150 = Info;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/tests/test6.cpp"
  ;
  local_140 = 0x13;
  local_138 = "int main()";
  local_130 = 0;
  local_128 = (Logger *)0x0;
  local_120 = false;
  local_118._M_p = (pointer)0x0;
  local_110 = "";
  local_108._M_allocated_capacity._0_4_ = NormalLog;
  local_108._8_8_ = (pointer)0x0;
  apStack_f8[0].__align = (pointer)0x0;
  apStack_f8[0]._8_8_ = (pointer)0x0;
  pWVar1 = el::base::Writer::construct((Writer *)local_160,1,"default");
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,"main: pid = ");
  }
  msg = getpid();
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,msg);
  }
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,", tid = ");
  }
  if (*(int *)(in_FS_OFFSET + -8) == 0) {
    mario::CurrentThread::cacheTid();
  }
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,*(int *)(in_FS_OFFSET + -8));
  }
  el::base::Writer::~Writer((Writer *)local_160);
  mario::EventLoopThread::EventLoopThread((EventLoopThread *)local_160);
  this = mario::EventLoopThread::startLoop((EventLoopThread *)local_160);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = runInThread;
  pcStack_1c0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_1d8._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  mario::EventLoop::runInLoop(this,(Functor *)local_1d8);
  if ((_Manager_type)local_1d8._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_1d8._16_8_)((_Any_data *)local_1d8,(_Any_data *)local_1d8,__destroy_functor);
  }
  sleep(1);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = runInThread;
  pcStack_1c0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_1d8._16_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  mario::EventLoop::runEvery(this,1.0,(TimerCallback *)local_1d8);
  if ((_Manager_type)local_1d8._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_1d8._16_8_)((_Any_data *)local_1d8,(_Any_data *)local_1d8,__destroy_functor);
  }
  sleep(5);
  mario::EventLoop::quit(this);
  local_1d8._0_8_ = &PTR__Writer_0012cd30;
  local_1d8._8_8_ = 0;
  local_1d8._16_4_ = 0x80;
  pcStack_1c0 = (code *)0x11f010;
  local_1b8 = 0x1e;
  local_1b0 = "int main()";
  local_1a8 = 0;
  local_1a0 = (Logger *)0x0;
  local_198 = false;
  local_190 = (Logger *)0x0;
  local_188 = "";
  local_180 = NormalLog;
  local_178 = (pointer)0x0;
  pbStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  pWVar1 = el::base::Writer::construct((Writer *)local_1d8,1,"default");
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,"exit main");
  }
  el::base::Writer::~Writer((Writer *)local_1d8);
  mario::EventLoopThread::~EventLoopThread((EventLoopThread *)local_160);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP

int main() {
    LOG(INFO) << "main: pid = "<< getpid() << ", tid = " << mario::CurrentThread::tid();

    mario::EventLoopThread loopThread;
    mario::EventLoop* loop = loopThread.startLoop();

    loop->runInLoop(runInThread);
    sleep(1);
    loop->runEvery(1, runInThread);
    sleep(5);
    loop->quit();

    LOG(INFO) << "exit main";
}